

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTexture.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  float fVar1;
  int iVar2;
  char *pcVar3;
  float *pfVar4;
  reference pvVar5;
  Vec3f VVar6;
  Vec2f local_228;
  Vec2f uv [3];
  Vec2f local_200;
  Vec3f c;
  size_t j;
  Vec3f vectors [3];
  undefined1 local_1b8 [8];
  Vec3f triangle [3];
  vector<int,_std::allocator<int>_> face;
  size_t i;
  TGAImage texture;
  Vec3f light_dir;
  Model model;
  string texture_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [8];
  string model_path;
  undefined1 local_60 [8];
  TinyRender render;
  TGAColor local_35;
  undefined1 local_30 [8];
  TGAImage framebuffer;
  char **argv_local;
  int argc_local;
  
  framebuffer._16_8_ = argv;
  TRM::TGAImage::TGAImage((TGAImage *)local_30,800,600,3);
  TRM::TGAColor::TGAColor(&local_35,'\0','\0','\0',0xff);
  TRM::TGAImage::clearColor((TGAImage *)local_30,&local_35);
  TRM::TinyRender::TinyRender((TinyRender *)local_60);
  TRM::TinyRender::attachBuffer((TinyRender *)local_60,(TGAImage *)local_30);
  std::operator+(local_80,ASSETS_ROOT_abi_cxx11_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &model.specularmap_.bytespp,ASSETS_ROOT_abi_cxx11_);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  TRM::Model::Model((Model *)&light_dir.field_1,pcVar3);
  pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                     ((vec<3,_float,_(glm::qualifier)0> *)&texture.field_0x14,0);
  *pfVar4 = 0.0;
  pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                     ((vec<3,_float,_(glm::qualifier)0> *)&texture.field_0x14,1);
  *pfVar4 = 0.0;
  pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                     ((vec<3,_float,_(glm::qualifier)0> *)&texture.field_0x14,2);
  *pfVar4 = -1.0;
  TRM::TGAImage::TGAImage((TGAImage *)&i);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  TRM::TGAImage::read_tga_file((TGAImage *)&i,pcVar3);
  TRM::TGAImage::flip_vertically((TGAImage *)&i);
  face.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  while( true ) {
    iVar2 = TRM::Model::nfaces((Model *)&light_dir.field_1);
    if ((pointer)(long)iVar2 <=
        face.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) break;
    TRM::Model::face((vector<int,_std::allocator<int>_> *)&triangle[2].field_2,
                     (Model *)&light_dir.field_1,
                     (int)face.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    for (stack0xfffffffffffffe10 = 0; stack0xfffffffffffffe10 < 3;
        register0x00000000 = stack0xfffffffffffffe10 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&triangle[2].field_2,
                          stack0xfffffffffffffe10);
      VVar6 = TRM::Model::vert((Model *)&light_dir.field_1,*pvVar5);
      c.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)VVar6.field_2;
      uv[2] = VVar6._0_8_;
      vectors[stack0xfffffffffffffe10].field_0 = c.field_0;
      vectors[stack0xfffffffffffffe10 - 1].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)uv[2].field_0;
      vectors[stack0xfffffffffffffe10 - 1].field_2 =
           (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)uv[2].field_1;
      local_200 = uv[2];
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)&local_200,0);
      fVar1 = *pfVar4;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)&local_200,0);
      *pfVar4 = (fVar1 + 1.0) * 800.0 * 0.5;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)&local_200,1);
      fVar1 = *pfVar4;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)&local_200,1);
      *pfVar4 = (fVar1 + 1.0) * 600.0 * 0.5;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)&local_200,0);
      fVar1 = *pfVar4;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)
                          &triangle[stack0xfffffffffffffe10 - 1].field_1,0);
      *pfVar4 = fVar1;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)&local_200,1);
      fVar1 = *pfVar4;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)
                          &triangle[stack0xfffffffffffffe10 - 1].field_1,1);
      *pfVar4 = fVar1;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)&local_200,2);
      fVar1 = *pfVar4;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)
                          &triangle[stack0xfffffffffffffe10 - 1].field_1,2);
      *pfVar4 = fVar1;
    }
    local_228 = TRM::Model::uv((Model *)&light_dir.field_1,
                               (int)face.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,0);
    uv[0] = TRM::Model::uv((Model *)&light_dir.field_1,
                           (int)face.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,1);
    uv[1] = TRM::Model::uv((Model *)&light_dir.field_1,
                           (int)face.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,2);
    TRM::TinyRender::triangle((TinyRender *)local_60,(Vec3f *)local_1b8,&local_228,(TGAImage *)&i);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)&triangle[2].field_2);
    face.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)((long)face.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 1);
  }
  TRM::TGAImage::flip_vertically((TGAImage *)local_30);
  TRM::TGAImage::write_png_stb((TGAImage *)local_30,"framebuffer.png");
  TRM::TGAImage::~TGAImage((TGAImage *)&i);
  TRM::Model::~Model((Model *)&light_dir.field_1);
  std::__cxx11::string::~string((string *)&model.specularmap_.bytespp);
  std::__cxx11::string::~string((string *)local_80);
  TRM::TinyRender::~TinyRender((TinyRender *)local_60);
  TRM::TGAImage::~TGAImage((TGAImage *)local_30);
  return 0;
}

Assistant:

int main(int argc, const char** argv) {
  TGAImage framebuffer(WIDTH, HEIGHT, TGAImage::RGB);
  framebuffer.clearColor(TGAColor(0, 0, 0));

  TinyRender render;
  render.attachBuffer(&framebuffer);

  std::string model_path = ASSETS_ROOT + "/african_head.obj";
  std::string texture_path = ASSETS_ROOT + "/african_head_diffuse.tga";

  Model model(model_path.c_str());

  Vec3f light_dir;
  light_dir[0] = 0;
  light_dir[1] = 0;
  light_dir[2] = -1.f;

  TGAImage texture;
  texture.read_tga_file(texture_path.c_str());
  texture.flip_vertically();

  /** draw all vertex triangle ***/
  for (size_t i = 0; i < model.nfaces(); i++) {
    std::vector<int> face = model.face(i);
    Vec3f triangle[3];
    Vec3f vectors[3];
    for (size_t j = 0; j < 3; j++) {
      Vec3f c = model.vert(face[j]);
      vectors[j] = c;
      c[0] = (c[0] + 1.f) * WIDTH / 2.f;
      c[1] = (c[1] + 1.f) * HEIGHT / 2.f;
      triangle[j][0] = c[0];
      triangle[j][1] = c[1];
      triangle[j][2] = c[2];
    }

    Vec2f uv[] = {model.uv(i, 0), model.uv(i, 1), model.uv(i, 2)};
    render.triangle(triangle, uv, &texture);
  }

  framebuffer.flip_vertically();
  framebuffer.write_png_stb("framebuffer.png");

  return 0;
}